

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

int __thiscall MIDIStreamer::FillStopBuffer(MIDIStreamer *this,int buffer_num)

{
  int iVar1;
  DWORD *pDVar2;
  int i;
  DWORD *events;
  int buffer_num_local;
  MIDIStreamer *this_local;
  
  pDVar2 = WriteStopNotes(this,this->Events[buffer_num]);
  *pDVar2 = 500;
  pDVar2[1] = 0;
  pDVar2[2] = 0x2000000;
  memset(this->Buffer + buffer_num,0,0x18);
  this->Buffer[buffer_num].lpData = (BYTE *)(this->Events + buffer_num);
  this->Buffer[buffer_num].dwBufferLength =
       ((int)pDVar2 + 0xc) - (int)this->Buffer[buffer_num].lpData;
  this->Buffer[buffer_num].dwBytesRecorded = this->Buffer[buffer_num].dwBufferLength;
  iVar1 = (*this->MIDI->_vptr_MIDIDevice[0xc])(this->MIDI,this->Buffer + buffer_num);
  if (iVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = iVar1 << 2 | 2;
  }
  return this_local._4_4_;
}

Assistant:

int MIDIStreamer::FillStopBuffer(int buffer_num)
{
	DWORD *events = Events[buffer_num];
	int i;

	events = WriteStopNotes(events);

	// wait some tics, just so that this buffer takes some time
	events[0] = 500;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;
	events += 3;

	memset(&Buffer[buffer_num], 0, sizeof(MIDIHDR));
	Buffer[buffer_num].lpData = (LPSTR)Events[buffer_num];
	Buffer[buffer_num].dwBufferLength = DWORD((LPSTR)events - Buffer[buffer_num].lpData);
	Buffer[buffer_num].dwBytesRecorded = Buffer[buffer_num].dwBufferLength;
	if (0 != (i = MIDI->PrepareHeader(&Buffer[buffer_num])))
	{
		return SONG_ERROR | (i << 2);
	}
	return SONG_MORE;
}